

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

cl_command_queue __thiscall
CLIntercept::getCommandBufferCommandQueue
          (CLIntercept *this,cl_uint numQueues,cl_command_queue *queues,cl_command_buffer_khr cmdbuf
          )

{
  mutex *__mutex;
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Base_ptr p_Var3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  undefined8 uVar6;
  _Base_ptr p_Var7;
  cl_command_queue p_Var8;
  vector<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_> queues_1;
  allocator_type local_5d;
  cl_uint local_5c;
  undefined1 local_58 [32];
  cl_command_queue local_38;
  
  if (queues != (cl_command_queue *)0x0 && numQueues != 0) {
    return *queues;
  }
  __mutex = &this->m_Mutex;
  local_5c = numQueues;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 != 0) {
    uVar6 = std::__throw_system_error(iVar2);
    if ((key_type)local_58._0_8_ != (key_type)0x0) {
      operator_delete((void *)local_58._0_8_);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar6);
  }
  local_38 = (cl_command_queue)0x0;
  p_Var7 = (this->m_CommandBufferInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var7 != (_Base_ptr)0x0) {
    p_Var1 = &(this->m_CommandBufferInfoMap)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = &p_Var1->_M_header;
    do {
      if (*(cl_command_buffer_khr *)(p_Var7 + 1) >= cmdbuf) {
        p_Var5 = p_Var7;
      }
      p_Var7 = (&p_Var7->_M_left)[*(cl_command_buffer_khr *)(p_Var7 + 1) < cmdbuf];
    } while (p_Var7 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var1) && (*(cl_command_buffer_khr *)(p_Var5 + 1) <= cmdbuf))
    {
      p_Var7 = p_Var5[1]._M_parent;
      p_Var5 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var1 = &(this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = &p_Var1->_M_header;
      if (p_Var5 == (_Base_ptr)0x0) {
LAB_0017a1ee:
        local_58._0_8_ = (key_type)0x0;
        pmVar4 = std::
                 map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
                 ::at(&this->m_DispatchX,(key_type *)local_58);
      }
      else {
        do {
          if (*(_Base_ptr *)(p_Var5 + 1) >= p_Var7) {
            p_Var3 = p_Var5;
          }
          p_Var5 = (&p_Var5->_M_left)[*(_Base_ptr *)(p_Var5 + 1) < p_Var7];
        } while (p_Var5 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var3 == p_Var1) || (p_Var7 < *(_Base_ptr *)(p_Var3 + 1)))
        goto LAB_0017a1ee;
        pmVar4 = (mapped_type *)&p_Var3[1]._M_parent;
      }
      if (pmVar4->clGetCommandBufferInfoKHR ==
          (_func_cl_int_cl_command_buffer_khr_cl_command_buffer_info_khr_size_t_void_ptr_size_t_ptr
           *)0x0) {
        local_58._0_8_ = local_58 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_58,"clGetCommandBufferInfoKHR","");
        getExtensionFunctionAddress(this,(cl_platform_id)p_Var7,(string *)local_58);
        if ((key_type)local_58._0_8_ != (key_type)(local_58 + 0x10)) {
          operator_delete((void *)local_58._0_8_);
        }
      }
      p_Var5 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var3 = &p_Var1->_M_header;
      if (p_Var5 == (_Base_ptr)0x0) {
LAB_0017a286:
        local_58._0_8_ = (key_type)0x0;
        pmVar4 = std::
                 map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
                 ::at(&this->m_DispatchX,(key_type *)local_58);
      }
      else {
        do {
          if (*(_Base_ptr *)(p_Var5 + 1) >= p_Var7) {
            p_Var3 = p_Var5;
          }
          p_Var5 = (&p_Var5->_M_left)[*(_Base_ptr *)(p_Var5 + 1) < p_Var7];
        } while (p_Var5 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var3 == p_Var1) ||
           (p_Var7 < (_Base_ptr)((_Rb_tree_header *)p_Var3)->_M_node_count)) goto LAB_0017a286;
        pmVar4 = (mapped_type *)((long)p_Var3 + 0x28);
      }
      if (pmVar4->clGetCommandBufferInfoKHR !=
          (_func_cl_int_cl_command_buffer_khr_cl_command_buffer_info_khr_size_t_void_ptr_size_t_ptr
           *)0x0) {
        (*pmVar4->clGetCommandBufferInfoKHR)(cmdbuf,0x1295,4,&local_5c,(size_t *)0x0);
        if ((ulong)local_5c != 0) {
          if (local_5c == 1) {
            (*pmVar4->clGetCommandBufferInfoKHR)(cmdbuf,0x1294,8,&local_38,(size_t *)0x0);
            p_Var8 = local_38;
          }
          else {
            std::vector<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_>::vector
                      ((vector<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_> *)local_58
                       ,(ulong)local_5c,&local_5d);
            (*pmVar4->clGetCommandBufferInfoKHR)
                      (cmdbuf,0x1294,local_58._8_8_ - local_58._0_8_,(void *)local_58._0_8_,
                       (size_t *)0x0);
            p_Var8 = *(cl_command_queue *)local_58._0_8_;
            operator_delete((void *)local_58._0_8_);
          }
          goto LAB_0017a2f4;
        }
      }
    }
  }
  p_Var8 = (cl_command_queue)0x0;
LAB_0017a2f4:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return p_Var8;
}

Assistant:

cl_command_queue CLIntercept::getCommandBufferCommandQueue(
    cl_uint numQueues,
    const cl_command_queue* queues,
    cl_command_buffer_khr cmdbuf )
{
    if( numQueues != 0 && queues != NULL )
    {
        return queues[0];
    }

    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_command_queue    queue = NULL;

    CCommandBufferInfoMap::iterator iter = m_CommandBufferInfoMap.find( cmdbuf );
    if( iter != m_CommandBufferInfoMap.end() )
    {
        cl_platform_id  platform = iter->second;
        if( dispatchX(platform).clGetCommandBufferInfoKHR == NULL )
        {
            getExtensionFunctionAddress(
                platform,
                "clGetCommandBufferInfoKHR" );
        }

        const auto& dispatchX = this->dispatchX(platform);
        if( dispatchX.clGetCommandBufferInfoKHR )
        {
            dispatchX.clGetCommandBufferInfoKHR(
                cmdbuf,
                CL_COMMAND_BUFFER_NUM_QUEUES_KHR,
                sizeof( numQueues ),
                &numQueues,
                NULL );
            if( numQueues == 1)
            {
                dispatchX.clGetCommandBufferInfoKHR(
                    cmdbuf,
                    CL_COMMAND_BUFFER_QUEUES_KHR,
                    sizeof( queue ),
                    &queue,
                    NULL );
            }
            else if( numQueues > 1 )
            {
                std::vector<cl_command_queue> queues(numQueues);
                dispatchX.clGetCommandBufferInfoKHR(
                    cmdbuf,
                    CL_COMMAND_BUFFER_QUEUES_KHR,
                    queues.size() * sizeof(queues[0]),
                    queues.data(),
                    NULL );
                queue = queues[0];
            }
        }
    }

    return queue;
}